

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_make_greeting.c
# Opt level: O3

void * x11_make_greeting(int endian,int protomajor,int protominor,int auth_proto,void *auth_data,
                        int auth_len,char *peer_addr,int peer_port,int *outlen)

{
  char *__s;
  uint uVar1;
  uint uVar2;
  ushort uVar3;
  char cVar4;
  int iVar5;
  size_t sVar6;
  time_t tVar7;
  char *__s_00;
  char cVar8;
  char cVar9;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  uchar realauthdata [64];
  undefined8 *local_98;
  unsigned_long local_80;
  undefined8 local_78;
  undefined1 uStack_70;
  undefined1 uStack_6f;
  ushort uStack_6e;
  undefined1 uStack_6c;
  undefined1 uStack_6b;
  ushort uStack_6a;
  ushort uStack_68;
  undefined6 uStack_66;
  
  __s = x11_authnames[auth_proto];
  sVar6 = strlen(__s);
  local_98 = (undefined8 *)auth_data;
  if (auth_proto != 1) {
    if (auth_len == 0x10 && auth_proto == 2) {
      local_80 = 0;
      x11_parse_ip(peer_addr,&local_80);
      local_98 = &local_78;
      uStack_6a = 0;
      uStack_68 = 0;
      uStack_66 = 0;
      local_78 = *auth_data;
      uStack_6e = (ushort)local_80 << 8 | (ushort)local_80 >> 8;
      uStack_6f = (undefined1)(local_80 >> 0x10);
      uStack_70 = (undefined1)(local_80 >> 0x18);
      uStack_6b = (undefined1)peer_port;
      uStack_6c = (undefined1)((uint)peer_port >> 8);
      tVar7 = time((time_t *)0x0);
      uVar3 = (ushort)((ulong)tVar7 >> 8);
      uStack_6a = (ushort)(byte)((ulong)tVar7 >> 0x18) | uVar3 & 0xff00;
      uStack_68 = uVar3 & 0xff | (ushort)((uint)((int)tVar7 << 0x18) >> 0x10);
      auth_len = 0x18;
      des_encrypt_xdmauth((void *)((long)auth_data + 9),local_98,0x18);
    }
    else {
      local_98 = &local_78;
      auth_len = 0;
    }
  }
  uVar10 = (int)sVar6 + 3U & 0xfffffffc;
  iVar5 = (auth_len + 3U & 0xfffffffc) + uVar10 + 0xc;
  __s_00 = (char *)safemalloc((long)iVar5,1,0);
  memset(__s_00,0,(long)iVar5);
  *__s_00 = (char)endian;
  uVar11 = (uint)protominor >> 8 & 0xff;
  bVar12 = (char)endian == 'B';
  uVar1 = protomajor;
  if (bVar12) {
    uVar1 = (uint)protomajor >> 8 & 0xff;
  }
  cVar8 = (char)((uint)protomajor >> 8);
  if (bVar12) {
    cVar8 = (char)protomajor;
  }
  __s_00[3] = cVar8;
  uVar2 = uVar11;
  if (bVar12) {
    uVar2 = protominor;
    protominor = uVar11;
  }
  __s_00[2] = (char)uVar1;
  __s_00[5] = (char)uVar2;
  cVar9 = (char)(sVar6 >> 8);
  cVar4 = cVar9;
  cVar8 = (char)sVar6;
  if (bVar12) {
    cVar4 = (char)sVar6;
    cVar8 = cVar9;
  }
  __s_00[4] = (char)protominor;
  __s_00[7] = cVar4;
  __s_00[6] = cVar8;
  cVar9 = (char)((uint)auth_len >> 8);
  cVar4 = cVar9;
  cVar8 = (char)auth_len;
  if (bVar12) {
    cVar4 = (char)auth_len;
    cVar8 = cVar9;
  }
  __s_00[9] = cVar4;
  __s_00[8] = cVar8;
  memcpy(__s_00 + 0xc,__s,(long)(int)sVar6);
  memcpy(__s_00 + (long)(int)uVar10 + 0xc,local_98,(long)auth_len);
  smemclr(&local_78,0x40);
  *outlen = iVar5;
  return __s_00;
}

Assistant:

void *x11_make_greeting(int endian, int protomajor, int protominor,
                        int auth_proto, const void *auth_data, int auth_len,
                        const char *peer_addr, int peer_port,
                        int *outlen)
{
    unsigned char *greeting;
    unsigned char realauthdata[64];
    const char *authname;
    const unsigned char *authdata;
    int authnamelen, authnamelen_pad;
    int authdatalen, authdatalen_pad;
    int greeting_len;

    authname = x11_authnames[auth_proto];
    authnamelen = strlen(authname);
    authnamelen_pad = (authnamelen + 3) & ~3;

    if (auth_proto == X11_MIT) {
        authdata = auth_data;
        authdatalen = auth_len;
    } else if (auth_proto == X11_XDM && auth_len == 16) {
        time_t t;
        unsigned long peer_ip = 0;

        x11_parse_ip(peer_addr, &peer_ip);

        authdata = realauthdata;
        authdatalen = 24;
        memset(realauthdata, 0, authdatalen);
        memcpy(realauthdata, auth_data, 8);
        PUT_32BIT_MSB_FIRST(realauthdata+8, peer_ip);
        PUT_16BIT_MSB_FIRST(realauthdata+12, peer_port);
        t = time(NULL);
        PUT_32BIT_MSB_FIRST(realauthdata+14, t);

        des_encrypt_xdmauth((char *)auth_data + 9, realauthdata, authdatalen);
    } else {
        authdata = realauthdata;
        authdatalen = 0;
    }

    authdatalen_pad = (authdatalen + 3) & ~3;
    greeting_len = 12 + authnamelen_pad + authdatalen_pad;

    greeting = snewn(greeting_len, unsigned char);
    memset(greeting, 0, greeting_len);
    greeting[0] = endian;
    PUT_16BIT_X11(endian, greeting+2, protomajor);
    PUT_16BIT_X11(endian, greeting+4, protominor);
    PUT_16BIT_X11(endian, greeting+6, authnamelen);
    PUT_16BIT_X11(endian, greeting+8, authdatalen);
    memcpy(greeting+12, authname, authnamelen);
    memcpy(greeting+12+authnamelen_pad, authdata, authdatalen);

    smemclr(realauthdata, sizeof(realauthdata));

    *outlen = greeting_len;
    return greeting;
}